

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O2

void __thiscall SubprocessTestReadStdin::~SubprocessTestReadStdin(SubprocessTestReadStdin *this)

{
  anon_unknown.dwarf_101077::SubprocessTest::~SubprocessTest(&this->super_SubprocessTest);
  operator_delete(this,0x2d8);
  return;
}

Assistant:

TEST_F(SubprocessTest, ReadStdin) {
  Subprocess* subproc = subprocs_.Add("cat -");
  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());
  ASSERT_EQ(ExitSuccess, subproc->Finish());
  ASSERT_EQ(1u, subprocs_.finished_.size());
}